

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

pair<ska::detailv3::sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>::templated_iterator<slang::ConstantValue>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<slang::ConstantValue,slang::ConstantValue,slang::Hasher<slang::ConstantValue>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ConstantValue>>,std::allocator<slang::ConstantValue>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>>>
::emplace<slang::ConstantValue&>
          (sherwood_v3_table<slang::ConstantValue,slang::ConstantValue,slang::Hasher<slang::ConstantValue>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<slang::ConstantValue>>,std::equal_to<slang::ConstantValue>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ConstantValue>>,std::allocator<slang::ConstantValue>,std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>>>
           *this,ConstantValue *key)

{
  EntryPointer psVar1;
  bool bVar2;
  size_t sVar3;
  long lVar4;
  EntryPointer current_entry;
  char distance_from_desired;
  EntryPointer psVar5;
  pair<ska::detailv3::sherwood_v3_table<slang::ConstantValue,_slang::ConstantValue,_slang::Hasher<slang::ConstantValue>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<slang::ConstantValue>_>,_std::equal_to<slang::ConstantValue>,_ska::detailv3::functor_storage<bool,_std::equal_to<slang::ConstantValue>_>,_std::allocator<slang::ConstantValue>,_std::allocator<ska::detailv3::sherwood_v3_entry<slang::ConstantValue>_>_>::templated_iterator<slang::ConstantValue>,_bool>
  pVar6;
  
  sVar3 = slang::ConstantValue::hash(key);
  lVar4 = (sVar3 * -0x61c8864680b583eb >> ((byte)this[0x10] & 0x3f)) * 0x30;
  current_entry = (EntryPointer)(*(long *)this + lVar4);
  if (*(char *)(*(long *)this + lVar4) < '\0') {
    distance_from_desired = '\0';
  }
  else {
    distance_from_desired = '\0';
    psVar5 = current_entry;
    do {
      bVar2 = slang::operator==(key,&(psVar5->field_1).value);
      if (bVar2) {
        pVar6._8_8_ = 0;
        pVar6.first.current = psVar5;
        return pVar6;
      }
      current_entry = psVar5 + 1;
      distance_from_desired = distance_from_desired + '\x01';
      psVar1 = psVar5 + 1;
      psVar5 = current_entry;
    } while (distance_from_desired <= psVar1->distance_from_desired);
  }
  pVar6 = emplace_new_key<slang::ConstantValue&>(this,distance_from_desired,current_entry,key);
  return pVar6;
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }